

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O1

void duckdb_je_pac_destroy(tsdn_t *tsdn,pac_t *pac)

{
  ehooks_t *ehooks;
  edata_t *edata;
  
  ehooks = duckdb_je_base_ehooks_get(pac->base);
  while( true ) {
    edata = duckdb_je_ecache_evict(tsdn,pac,ehooks,&pac->ecache_retained,0);
    if (edata == (edata_t *)0x0) break;
    duckdb_je_extent_destroy_wrapper(tsdn,pac,ehooks,edata);
  }
  return;
}

Assistant:

void
pac_destroy(tsdn_t *tsdn, pac_t *pac) {
	assert(ecache_npages_get(&pac->ecache_dirty) == 0);
	assert(ecache_npages_get(&pac->ecache_muzzy) == 0);
	/*
	 * Iterate over the retained extents and destroy them.  This gives the
	 * extent allocator underlying the extent hooks an opportunity to unmap
	 * all retained memory without having to keep its own metadata
	 * structures.  In practice, virtual memory for dss-allocated extents is
	 * leaked here, so best practice is to avoid dss for arenas to be
	 * destroyed, or provide custom extent hooks that track retained
	 * dss-based extents for later reuse.
	 */
	ehooks_t *ehooks = pac_ehooks_get(pac);
	edata_t *edata;
	while ((edata = ecache_evict(tsdn, pac, ehooks,
	    &pac->ecache_retained, 0)) != NULL) {
		extent_destroy_wrapper(tsdn, pac, ehooks, edata);
	}
}